

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O1

void __thiscall
QtPromisePrivate::PromiseDataBase<int,void(int_const&)>::reject<std::shared_ptr<int>&>
          (PromiseDataBase<int,void(int_const&)> *this,shared_ptr<int> *error)

{
  exception_ptr eVar1;
  void *__tmp;
  exception_ptr local_20;
  long local_18;
  
  PromiseError::PromiseError<std::shared_ptr<int>>((PromiseError *)&local_20,error);
  eVar1._M_exception_object = local_20._M_exception_object;
  local_20._M_exception_object = (void *)0x0;
  local_18 = *(long *)(this + 0x50);
  *(void **)(this + 0x50) = eVar1._M_exception_object;
  if (local_18 != 0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  if (local_20._M_exception_object != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  PromiseDataBase<int,_void_(const_int_&)>::setSettled
            ((PromiseDataBase<int,_void_(const_int_&)> *)this);
  return;
}

Assistant:

void reject(E&& error)
    {
        Q_ASSERT(isPending());
        Q_ASSERT(m_error.isNull());
        m_error = PromiseError{std::forward<E>(error)};
        setSettled();
    }